

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

uint LiteScript::Syntax::ReadComment(char *text)

{
  bool bVar1;
  uint local_1c;
  uint i;
  char *text_local;
  
  if (*text == '/') {
    if (text[1] == '/') {
      local_1c = 2;
      while( true ) {
        bVar1 = false;
        if (text[local_1c] != '\n') {
          bVar1 = text[local_1c] != '\0';
        }
        if (!bVar1) break;
        local_1c = local_1c + 1;
      }
      text_local._4_4_ = local_1c;
    }
    else if (text[1] == '*') {
      for (local_1c = 2; text[local_1c] != '\0'; local_1c = local_1c + 1) {
        if ((text[local_1c] == '*') && (text[local_1c + 1] == '/')) {
          local_1c = local_1c + 2;
          break;
        }
      }
      text_local._4_4_ = local_1c;
    }
    else {
      text_local._4_4_ = 0;
    }
  }
  else {
    text_local._4_4_ = 0;
  }
  return text_local._4_4_;
}

Assistant:

unsigned int LiteScript::Syntax::ReadComment(const char *text) {
    if (text[0] != '/')
        return 0;
    unsigned int i;
    if (text[1] == '/') {
        for (i = 2; text[i] != '\n' && text[i] != '\0'; i++);
        return i;
    }
    else if (text[1] == '*') {
        for (i = 2; text[i] != '\0'; i++) {
            if (text[i] == '*' && text[i + 1] == '/') {
                i += 2;
                break;
            }
        }
        return i;
    }
    else {
        return 0;
    }
}